

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockAreaLayout::plug(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  QLayoutItem *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  QList<int>::mid((QList<int> *)&local_40,path,1,-1);
  pQVar2 = QDockAreaLayoutInfo::plug(this->docks + iVar1,(QList<int> *)&local_40);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
  QDockAreaLayoutInfo::reparentWidgets(this->docks + iVar1,&this->mainWindow->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayout::plug(const QList<int> &path)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    QLayoutItem *item = docks[index].plug(path.mid(1));
    docks[index].reparentWidgets(mainWindow);
    return item;
#else
    return nullptr;
#endif
}